

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall Database::destroy_dataset(Database *this,string *dsname)

{
  string_view_t fmt;
  bool bVar1;
  __type_conflict2 _Var2;
  pointer this_00;
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  *in_RDI;
  OnDiskDataset *unaff_retaddr;
  iterator it;
  OnDiskDataset *in_stack_00000088;
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  byte bVar3;
  byte bVar4;
  const_iterator in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  string local_40 [32];
  unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *local_20;
  __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
       std::
       vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
       ::begin(in_stack_ffffffffffffff78);
  while( true ) {
    local_20 = (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
               std::
               vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
               ::end(in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
    ::operator*(local_18);
    this_00 = std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::operator->
                        ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)0x135c22)
    ;
    OnDiskDataset::get_name_abi_cxx11_(this_00);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffa0._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff98._M_current);
    bVar3 = 1;
    bVar4 = bVar3;
    if (!_Var2) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
      ::operator*(local_18);
      std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::operator->
                ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)0x135c5b);
      OnDiskDataset::get_id_abi_cxx11_(in_stack_00000088);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffffa0._M_current,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff98._M_current);
      bVar4 = bVar3;
      std::__cxx11::string::~string(local_40);
    }
    if ((bVar3 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
      ::operator++(local_18);
    }
    else {
      ::fmt::v6::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_ffffffffffffff80,
                 (char *)in_stack_ffffffffffffff78);
      fmt.data_._6_1_ = bVar3;
      fmt.data_._0_6_ = in_stack_ffffffffffffff88;
      fmt.data_._7_1_ = bVar4;
      fmt.size_ = (size_t)in_RDI;
      spdlog::info<std::__cxx11::string>(fmt,in_stack_ffffffffffffff80);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
      ::operator*(local_18);
      std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::operator->
                ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)0x135cdc);
      OnDiskDataset::drop(unaff_retaddr);
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &in_RDI[8].
            super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>const*,std::vector<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>,std::allocator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>>>
      ::__normal_iterator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>*>
                ((__normal_iterator<const_std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                  *)in_stack_ffffffffffffff80,
                 (__normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                  *)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffffa0 =
           std::
           vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
           ::erase(in_RDI,in_stack_ffffffffffffff98);
      local_18[0]._M_current =
           (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
           in_stack_ffffffffffffffa0;
    }
  }
  return;
}

Assistant:

void Database::destroy_dataset(const std::string &dsname) {
    for (auto it = loaded_datasets.begin(); it != loaded_datasets.end();) {
        if ((*it)->get_name() == dsname || (*it)->get_id() == dsname) {
            spdlog::info("DESTROY: {}", dsname);
            (*it)->drop();
            it = loaded_datasets.erase(it);
        } else {
            ++it;
        }
    }
}